

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExFreakOperator.cpp
# Opt level: O2

void __thiscall lts2::ExFreakOperator::initWithPatchSize(ExFreakOperator *this,Size *patchSize)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  IntegratingCell *pIVar5;
  BasisFunction *pBVar6;
  uint j;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint ring;
  int i;
  long lVar12;
  uint *puVar13;
  float fVar14;
  double dVar15;
  float local_78 [12];
  undefined8 local_48;
  float local_40;
  float local_3c;
  Size local_38;
  
  local_38 = *patchSize;
  LBDOperator::setPatchSize(&this->super_LBDOperator,&local_38);
  iVar1 = (this->super_LBDOperator)._patchSize.width;
  iVar2 = (this->super_LBDOperator)._patchSize.height;
  if (iVar1 < iVar2) {
    iVar2 = iVar1;
  }
  fVar14 = ((float)iVar2 * 22.0) / 1575.0;
  local_78[0] = (float)(iVar2 / 0x19);
  local_78[1] = fVar14 + local_78[0];
  local_78[2] = fVar14 * 3.0 + local_78[0];
  local_78[3] = fVar14 * 6.0 + local_78[0];
  local_78[4] = fVar14 * 10.0 + local_78[0];
  local_78[5] = fVar14 * 15.0 + local_78[0];
  local_78[6] = fVar14 * 21.0 + local_78[0];
  local_78[7] = 0.0;
  local_78[8] = local_78[0] * 0.5;
  local_78[9] = local_78[1] * 0.5;
  local_78[10] = local_78[2] * 0.5;
  local_78[0xb] = local_78[3] * 0.5;
  local_48 = CONCAT44(local_78[5] * 0.5,local_78[4] * 0.5);
  local_40 = local_78[6] * 0.5;
  local_3c = local_78[0] / 3.0;
  for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"ring[");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)lVar12);
    poVar4 = std::operator<<(poVar4,"] = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_78[lVar12]);
    poVar4 = std::operator<<(poVar4," (");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_78[lVar12 + 8]);
    poVar4 = std::operator<<(poVar4,")");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  (this->super_LBDOperator)._patternPoints = 0x2b;
  pIVar5 = (this->super_LBDOperator)._sensitiveCells;
  if (pIVar5 == (IntegratingCell *)0x0) {
    uVar11 = 0x408;
  }
  else {
    operator_delete__(pIVar5);
    uVar11 = (ulong)(this->super_LBDOperator)._patternPoints * 0x18;
  }
  pIVar5 = (IntegratingCell *)operator_new__(uVar11);
  (this->super_LBDOperator)._sensitiveCells = pIVar5;
  puVar13 = FREAKS_CELLS_PER_RING;
  for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
    uVar8 = *puVar13;
    dVar15 = (double)uVar8;
    LBDOperator::updateRingCells
              (&this->super_LBDOperator,pIVar5,uVar8,local_78[lVar12 + 8],local_78[lVar12],
               (float)(6.283185307179586 / dVar15),
               (float)((double)(int)lVar12 * (3.141592653589793 / dVar15)));
    pIVar5 = pIVar5 + uVar8;
    puVar13 = puVar13 + 1;
  }
  uVar8 = (this->super_LBDOperator)._patternPoints;
  uVar3 = (uVar8 - 1) * uVar8 >> 1;
  *(uint *)&(this->super_LBDOperator).super_LinearOperator.field_0xc = uVar3;
  pBVar6 = (this->super_LBDOperator)._basisFunctions;
  if (pBVar6 != (BasisFunction *)0x0) {
    operator_delete__(pBVar6);
    uVar3 = *(uint *)&(this->super_LBDOperator).super_LinearOperator.field_0xc;
    uVar8 = (this->super_LBDOperator)._patternPoints;
  }
  pBVar6 = (BasisFunction *)operator_new__((ulong)uVar3 << 3);
  (this->super_LBDOperator)._basisFunctions = pBVar6;
  uVar7 = 0;
  for (uVar3 = 1; uVar3 < uVar8; uVar3 = uVar3 + 1) {
    for (uVar9 = 0; uVar10 = uVar7 + uVar9, uVar3 != uVar9; uVar9 = uVar9 + 1) {
      pBVar6[uVar10].pos_cell = uVar9;
      pBVar6[uVar10].neg_cell = uVar3;
    }
    uVar7 = uVar10;
  }
  return;
}

Assistant:

void lts2::ExFreakOperator::initWithPatchSize(cv::Size patchSize)
{
    // Set the size variable
    this->setPatchSize(patchSize);
    
    int patchRadius = MIN(_patchSize.width, _patchSize.height);
    
    // Update the filter sizes
    // unit = (smallest_radius - biggest_radius) / 21
    float unitSpace = 22.0f * patchRadius / 1575.f;
    
    float ringRadius[8];
    ringRadius[0] = patchRadius / 25;
    ringRadius[1] = ringRadius[0] + 1  * unitSpace; //
    ringRadius[2] = ringRadius[0] + 3  * unitSpace; //
    ringRadius[3] = ringRadius[0] + 6  * unitSpace; //
    ringRadius[4] = ringRadius[0] + 10 * unitSpace; // 
    ringRadius[5] = ringRadius[0] + 15 * unitSpace; // 
    ringRadius[6] = ringRadius[0] + 21 * unitSpace; //
    ringRadius[7] = 0;                              // Center point
    
    float filterSigma[8];
    filterSigma[0] = ringRadius[0] / 2;
    filterSigma[1] = ringRadius[1] / 2;
    filterSigma[2] = ringRadius[2] / 2;
    filterSigma[3] = ringRadius[3] / 2;
    filterSigma[4] = ringRadius[4] / 2;
    filterSigma[5] = ringRadius[5] / 2;
    filterSigma[6] = ringRadius[6] / 2;
    filterSigma[7] = ringRadius[0] / 3; // Center point

#ifdef DEBUG
    for (int i = 0; i < 8; ++i)
        std::cerr << "ring[" << i << "] = " << ringRadius[i] << " (" << filterSigma[i] << ")" << std::endl;
#endif

    // Create the measurement points
    _patternPoints = 0;
    for (int ring = 0; ring < 8; ++ring)
        _patternPoints += FREAKS_CELLS_PER_RING[ring];
    
    // Reset
    if (_sensitiveCells)
        delete[] _sensitiveCells;
    _sensitiveCells = new lbd::IntegratingCell[_patternPoints];
    
    lbd::IntegratingCell* p_cells = _sensitiveCells;
    for (unsigned int ring = 0; ring < 8; ++ring)
    {
        float phi = M_PI / FREAKS_CELLS_PER_RING[ring] * ring;
        float omega = 2.0 * M_PI / FREAKS_CELLS_PER_RING[ring];
        
        updateRingCells(p_cells, FREAKS_CELLS_PER_RING[ring], filterSigma[ring], 
                        ringRadius[ring], omega, phi);
        
        p_cells += FREAKS_CELLS_PER_RING[ring];
    }
    
    // Create all the possible pairs
    _pairsInUse = _patternPoints*(_patternPoints-1)/2;

    /// TODO : fix this ugly hack by a proper init of _basisFunctions in the superclass
    if (_basisFunctions) 
      delete[] _basisFunctions; 

    _basisFunctions = new lbd::BasisFunction[_pairsInUse];
    for (unsigned int j = 1, k = 0; j < _patternPoints; ++j)
        for (unsigned i = 0; i < j; ++i, ++k)
        {
            _basisFunctions[k].pos_cell = i;
            _basisFunctions[k].neg_cell = j;
        }
}